

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::add_val(CVmObjDate *this,vm_val_t *result,vm_obj_id_t param_3,vm_val_t *val)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_date_ext *pvVar2;
  int *in_RCX;
  vm_val_t *in_RSI;
  bignum_t<32> *in_RDI;
  double dVar3;
  double dd;
  bignum_t<32> d;
  int32_t daytime;
  int32_t dayno;
  vm_val_t *in_stack_ffffffffffffff78;
  int32_t *in_stack_ffffffffffffff88;
  int32_t *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffffa8;
  bignum_t<32> *in_stack_ffffffffffffffb0;
  
  pvVar2 = get_ext((CVmObjDate *)in_RDI);
  iVar1 = pvVar2->dayno;
  get_ext((CVmObjDate *)in_RDI);
  if (*in_RCX != 7) {
    bignum_t<32>::bignum_t(in_RDI,in_stack_ffffffffffffff78);
    dVar3 = bignum_t::operator_cast_to_double((bignum_t<32> *)0x34635e);
    dVar3 = floor(dVar3);
    if ((2147483647.0 < dVar3 + (double)iVar1) || (dVar3 + (double)iVar1 < -2147483648.0)) {
      err_throw(0);
    }
    bignum_t<32>::operator-(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    bignum_t<32>::operator*(in_stack_ffffffffffffffb0,(long)in_stack_ffffffffffffffa8);
    bignum_t::operator_cast_to_double((bignum_t<32> *)0x3463f0);
    round_int32((double)in_stack_ffffffffffffff90);
    caldate_t::normalize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  obj = create((int)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,(int32_t)((ulong)in_RSI >> 0x20));
  vm_val_t::set_obj(in_RSI,obj);
  return 1;
}

Assistant:

int CVmObjDate::add_val(VMG_ vm_val_t *result, vm_obj_id_t /*self*/,
                        const vm_val_t *val)
{
    /* get my date and time */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;
    
    /* the other value must be something numeric */
    if (val->typ == VM_INT)
    {
        /* it's a simple integer - add it as a number of days */
        dayno += val->val.intval;
    }
    else
    {
        /* it's not an int; calculate in the bignum domain */
        bignum_t<32>d(vmg_ val);

        /* make sure the integer portion won't overflow */
        double dd = floor((double)d);
        if (dd + dayno > INT32MAXVAL || dd + dayno < INT32MINVAL)
            err_throw(VMERR_NUM_OVERFLOW);

        /* add the whole part to my day number */
        dayno += (int32_t)dd;

        /* 
         *   convert the fractional part to milliseconds (by multiplying it
         *   by the number of milliseconds in a day), then add it to my time
         *   value 
         */
        daytime += round_int32((double)((d - dd) * (long)(24L*60*60*1000)));

        /* normalize, to carry time overflow/underflow into the date */
        caldate_t::normalize(dayno, daytime);
    }

    /* return a new Date object representing the result */
    result->set_obj(create(vmg_ FALSE, dayno, daytime));

    /* handled */
    return TRUE;
}